

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall ThreadedReplayer::sync_worker_threads(ThreadedReplayer *this)

{
  PFN_vkDestroyPipelineCache p_Var1;
  pointer this_00;
  VkDevice pVVar2;
  uint local_14;
  uint i;
  ThreadedReplayer *this_local;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    sync_worker_memory_context(this,local_14);
    p_Var1 = vkDestroyPipelineCache;
    if (this->memory_context_pipeline_cache[local_14] != (VkPipelineCache)0x0) {
      this_00 = std::
                unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
                operator->(&this->device);
      pVVar2 = Fossilize::VulkanDevice::get_device(this_00);
      (*p_Var1)(pVVar2,this->memory_context_pipeline_cache[local_14],(VkAllocationCallbacks *)0x0);
    }
    this->memory_context_pipeline_cache[local_14] = (VkPipelineCache)0x0;
  }
  return;
}

Assistant:

void sync_worker_threads()
	{
		for (unsigned i = 0; i < NUM_MEMORY_CONTEXTS; i++)
		{
			sync_worker_memory_context(i);
			if (memory_context_pipeline_cache[i])
				vkDestroyPipelineCache(device->get_device(), memory_context_pipeline_cache[i], nullptr);
			memory_context_pipeline_cache[i] = VK_NULL_HANDLE;
		}
	}